

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

enable_if_t<std::is_base_of<interface_type,_Implementation1>::value,_interface_reference> __thiscall
poly::
vector<Interface,std::allocator<Interface>,poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>
::emplace_back<Implementation1,int>
          (vector<Interface,std::allocator<Interface>,poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>
           *this,int *args)

{
  bool bVar1;
  interface_reference pIVar2;
  unsigned_long a;
  unsigned_long s;
  int *args_local;
  vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
  *this_local;
  
  bVar1 = vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
          ::can_construct_new_elem
                    ((vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
                      *)this,0x10,8);
  if (bVar1) {
    push_back_new_elem<Implementation1,int>(this,args);
  }
  else {
    push_back_new_elem_w_storage_increase<Implementation1,int>(this,args);
  }
  pIVar2 = vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
           ::back((vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
                   *)this);
  return pIVar2;
}

Assistant:

inline auto vector<IF, Allocator, CloningPolicy>::emplace_back(Args&&... args)
    -> std::enable_if_t<std::is_base_of<interface_type, T>::value, interface_reference>
{
    constexpr auto s = sizeof(T);
    constexpr auto a = alignof(T);
    if (!can_construct_new_elem(s, a)) {
        push_back_new_elem_w_storage_increase(type_tag<T> {}, std::forward<Args>(args)...);
    } else {
        push_back_new_elem(type_tag<T> {}, std::forward<Args>(args)...);
    }
    return back();
}